

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.cpp
# Opt level: O2

void Commands::HideImpl(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *arguments,Character *from,bool set)

{
  Character *pCVar1;
  bool bVar2;
  int iVar3;
  undefined4 extraout_var;
  uint uVar4;
  undefined7 in_register_00000011;
  uint unsetflags;
  pointer __lhs;
  allocator<char> local_b9;
  Character *local_b8;
  undefined4 local_ac;
  string local_a8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_88;
  string local_70;
  string local_50;
  
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_a8,",",&local_b9);
  util::lowercase(&local_70,
                  (arguments->
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_start);
  local_ac = (undefined4)CONCAT71(in_register_00000011,set);
  local_b8 = from;
  util::explode(&local_88,&local_a8,&local_70);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_a8);
  unsetflags = 0;
  __lhs = local_88.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start;
  do {
    if (__lhs == local_88.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_88);
      if ((char)local_ac == '\0') {
        Character::Unhide(local_b8,unsetflags);
      }
      else {
        Character::Hide(local_b8,unsetflags);
      }
      return;
    }
    bVar2 = std::operator==(__lhs,"invisible");
    uVar4 = 1;
    if (!bVar2) {
      bVar2 = std::operator==(__lhs,"online");
      uVar4 = 2;
      if (!bVar2) {
        bVar2 = std::operator==(__lhs,"npc");
        uVar4 = 4;
        if (!bVar2) {
          bVar2 = std::operator==(__lhs,"admin");
          uVar4 = 8;
          if (!bVar2) {
            bVar2 = std::operator==(__lhs,"warp");
            uVar4 = 0x10;
            if (!bVar2) {
              bVar2 = std::operator==(__lhs,"all");
              pCVar1 = local_b8;
              uVar4 = 0x1f;
              if (!bVar2) {
                iVar3 = (*(local_b8->super_Command_Source)._vptr_Command_Source[4])(local_b8);
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_a8,"invalid_hide_flag",(allocator<char> *)&local_70);
                I18N::Format<>(&local_50,(I18N *)(CONCAT44(extraout_var,iVar3) + 0x490),&local_a8);
                (*(pCVar1->super_Command_Source)._vptr_Command_Source[5])(pCVar1,&local_50);
                std::__cxx11::string::~string((string *)&local_50);
                std::__cxx11::string::~string((string *)&local_a8);
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::~vector(&local_88);
                return;
              }
            }
          }
        }
      }
    }
    unsetflags = unsetflags | uVar4 | ((unsetflags | uVar4) & 0xfffffffe) << 0x10;
    __lhs = __lhs + 1;
  } while( true );
}

Assistant:

void HideImpl(const std::vector<std::string>& arguments, Character* from, bool set)
{
	int flags = 0;

	for (const auto& flag : util::explode(",", util::lowercase(arguments[0])))
	{
		     if (flag == "invisible") flags |= Character::HideInvisible;
		else if (flag == "online")    flags |= Character::HideOnline;
		else if (flag == "npc")       flags |= Character::HideNpc;
		else if (flag == "admin")     flags |= Character::HideAdmin;
		else if (flag == "warp")      flags |= Character::HideWarp;
		else if (flag == "all")       flags |= Character::HideAll;
		else
		{
			from->ServerMsg(from->SourceWorld()->i18n.Format("invalid_hide_flag"));
			return;
		}

		int explicit_flags = (flags & ~Character::HideInvisible) << 16;
		flags |= explicit_flags;
	}

	if (set)
		from->Hide(flags);
	else
		from->Unhide(flags);
}